

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

ServiceDescriptor * __thiscall
google::protobuf::FileDescriptor::FindServiceByName(FileDescriptor *this,string *key)

{
  char *__s1;
  long lVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  ServiceDescriptor *pSVar5;
  long *plVar6;
  long lVar7;
  char *pcVar8;
  long *plVar9;
  
  __s1 = (key->_M_dataplus)._M_p;
  cVar3 = *__s1;
  if (cVar3 == '\0') {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    pcVar8 = __s1;
    do {
      pcVar8 = pcVar8 + 1;
      lVar7 = (long)cVar3 + lVar7 * 5;
      cVar3 = *pcVar8;
    } while (cVar3 != '\0');
  }
  lVar1 = *(long *)(*(long *)(this + 0x90) + 8);
  uVar2 = *(ulong *)(*(long *)(this + 0x90) + 0x10);
  plVar6 = *(long **)(lVar1 + ((ulong)((long)this * 0xffff + lVar7) % uVar2) * 8);
  plVar9 = (long *)0x0;
  if (plVar6 != (long *)0x0) {
    do {
      if (((FileDescriptor *)*plVar6 == this) &&
         (iVar4 = strcmp(__s1,(char *)plVar6[1]), plVar9 = plVar6, iVar4 == 0)) break;
      plVar6 = (long *)plVar6[4];
      plVar9 = (long *)0x0;
    } while (plVar6 != (long *)0x0);
  }
  if (plVar9 == (long *)0x0) {
    plVar9 = *(long **)(lVar1 + uVar2 * 8);
  }
  plVar6 = plVar9 + 2;
  if (plVar9 == *(long **)(lVar1 + uVar2 * 8)) {
    plVar6 = (long *)&(anonymous_namespace)::kNullSymbol;
  }
  pSVar5 = (ServiceDescriptor *)0x0;
  if ((anonymous_namespace)::kNullSymbol != 0) {
    pSVar5 = DAT_002975f8;
  }
  if ((int)*plVar6 == 5) {
    pSVar5 = (ServiceDescriptor *)plVar6[1];
  }
  return pSVar5;
}

Assistant:

const ServiceDescriptor*
FileDescriptor::FindServiceByName(const string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::SERVICE);
  if (!result.IsNull()) {
    return result.service_descriptor;
  } else {
    return NULL;
  }
}